

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_structurizer.cpp
# Opt level: O2

bool __thiscall
dxil_spv::CFGStructurizer::block_is_load_bearing(CFGStructurizer *this,CFGNode *node,CFGNode *merge)

{
  bool bVar1;
  
  while ((long)(merge->succ).
               super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)(merge->succ).
               super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
               ._M_impl.super__Vector_impl_data._M_start == 8) {
    bVar1 = merge_candidate_is_on_breaking_path(this,merge);
    if ((!bVar1) ||
       ((merge->ir).operations.
        super__Vector_base<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (merge->ir).operations.
        super__Vector_base<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>
        ._M_impl.super__Vector_impl_data._M_finish)) break;
    bVar1 = block_is_control_dependent(merge);
    if (bVar1) break;
    merge = *(merge->succ).
             super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  if ((ulong)((long)(node->pred).
                    super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(node->pred).
                   super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                   ._M_impl.super__Vector_impl_data._M_start) < 9) {
    bVar1 = false;
  }
  else {
    bVar1 = exists_path_in_cfg_without_intermediate_node(this,node->immediate_dominator,merge,node);
    bVar1 = !bVar1;
  }
  return bVar1;
}

Assistant:

bool CFGStructurizer::block_is_load_bearing(const CFGNode *node, const CFGNode *merge) const
{
	while (merge->succ.size() == 1)
	{
		// If we're going to eliminate a block due to impossible merge,
		// we should look ahead since we might get a false positive.
		bool breaking = merge_candidate_is_on_breaking_path(merge);
		if (breaking && !merge->ir.operations.empty() && !block_is_control_dependent(merge))
			merge = merge->succ.front();
		else
			break;
	}

	return node->pred.size() >= 2 &&
	       !exists_path_in_cfg_without_intermediate_node(node->immediate_dominator, merge, node);
}